

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

int lws_token_from_index(lws *wsi,int index,char **arg,int *len,uint32_t *hdr_len)

{
  lws_h2_netconn *plVar1;
  lws *wsi_00;
  hpack_dynamic_table *phVar2;
  size_t sVar3;
  hpack_dynamic_table *dyn;
  uint32_t *hdr_len_local;
  int *len_local;
  char **arg_local;
  int index_local;
  lws *wsi_local;
  
  if (index == 0xffff) {
    wsi_local._4_4_ = 0xffff;
  }
  else {
    wsi_00 = lws_get_network_wsi(wsi);
    if ((wsi_00->h2).h2n == (lws_h2_netconn *)0x0) {
      wsi_local._4_4_ = 0xffffffff;
    }
    else {
      plVar1 = (wsi_00->h2).h2n;
      phVar2 = &plVar1->hpack_dyn_table;
      if (index < 0) {
        wsi_local._4_4_ = 0xffffffff;
      }
      else if (index < 0x3e) {
        if ((arg != (char **)0x0) && (index < 0x11)) {
          *arg = http2_canned[index];
          sVar3 = strlen(http2_canned[index]);
          *len = (int)sVar3;
        }
        if (hdr_len != (uint32_t *)0x0) {
          *hdr_len = (uint)""[index];
        }
        wsi_local._4_4_ = (uint)""[index];
      }
      else if (phVar2 == (hpack_dynamic_table *)0x0) {
        _lws_log(4,"no dynamic table\n");
        wsi_local._4_4_ = 0xffffffff;
      }
      else if (index < (int)((plVar1->hpack_dyn_table).used_entries + 0x3e)) {
        arg_local._4_4_ =
             (int)(((plVar1->hpack_dyn_table).pos - 1) - (index + -0x3e)) %
             (int)(uint)(plVar1->hpack_dyn_table).num_entries;
        if ((int)arg_local._4_4_ < 0) {
          arg_local._4_4_ = (plVar1->hpack_dyn_table).num_entries + arg_local._4_4_;
        }
        _lws_log(0x40,"%s: dyn index %d, tok %d\n","lws_token_from_index",(ulong)arg_local._4_4_,
                 (ulong)phVar2->entries[(int)arg_local._4_4_].lws_hdr_idx);
        if ((arg != (char **)0x0) && (len != (int *)0x0)) {
          *arg = phVar2->entries[(int)arg_local._4_4_].value;
          *len = (uint)phVar2->entries[(int)arg_local._4_4_].value_len;
        }
        if (hdr_len != (uint32_t *)0x0) {
          *hdr_len = (uint)phVar2->entries[(int)arg_local._4_4_].hdr_len;
        }
        wsi_local._4_4_ = (uint)phVar2->entries[(int)arg_local._4_4_].lws_hdr_idx;
      }
      else {
        _lws_log(8,"  %s: adjusted index %d >= %d\n","lws_token_from_index",(ulong)(uint)index,
                 (ulong)((plVar1->hpack_dyn_table).used_entries + 0x3e));
        lws_h2_goaway(wsi_00,9,"index out of range");
        wsi_local._4_4_ = 0xffffffff;
      }
    }
  }
  return wsi_local._4_4_;
}

Assistant:

static int
lws_token_from_index(struct lws *wsi, int index, const char **arg, int *len,
		     uint32_t *hdr_len)
{
	struct hpack_dynamic_table *dyn;

	if (index == LWS_HPACK_IGNORE_ENTRY)
		return LWS_HPACK_IGNORE_ENTRY;

	/* dynamic table only belongs to network wsi */
	wsi = lws_get_network_wsi(wsi);
	if (!wsi->h2.h2n)
		return -1;

	dyn = &wsi->h2.h2n->hpack_dyn_table;

	if (index < 0)
		return -1;

	if (index < (int)LWS_ARRAY_SIZE(static_token)) {
		if (arg && index < (int)LWS_ARRAY_SIZE(http2_canned)) {
			*arg = http2_canned[index];
			*len = (int)strlen(http2_canned[index]);
		}
		if (hdr_len)
			*hdr_len = static_hdr_len[index];

		return static_token[index];
	}

	if (!dyn) {
		lwsl_notice("no dynamic table\n");
		return -1;
	}

	if (index >= (int)LWS_ARRAY_SIZE(static_token) + dyn->used_entries) {
		lwsl_info("  %s: adjusted index %d >= %d\n", __func__, index,
				(int)LWS_ARRAY_SIZE(static_token) + dyn->used_entries);
		lws_h2_goaway(wsi, H2_ERR_COMPRESSION_ERROR,
			      "index out of range");
		return -1;
	}

	index -= (int)LWS_ARRAY_SIZE(static_token);
	index = (dyn->pos - 1 - index) % dyn->num_entries;
	if (index < 0)
		index += dyn->num_entries;

	lwsl_header("%s: dyn index %d, tok %d\n", __func__, index,
		    dyn->entries[index].lws_hdr_idx);

	if (arg && len) {
		*arg = dyn->entries[index].value;
		*len = dyn->entries[index].value_len;
	}

	if (hdr_len)
		*hdr_len = dyn->entries[index].hdr_len;

	return dyn->entries[index].lws_hdr_idx;
}